

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenConstructor
          (string *__return_storage_ptr__,SwiftGenerator *this,string *offset)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *offset_local;
  SwiftGenerator *this_local;
  
  local_20 = offset;
  offset_local = (string *)this;
  this_local = (SwiftGenerator *)__return_storage_ptr__;
  std::operator+(&local_40,"{{VALUETYPE}}({{ACCESS}}.bb, o: ",offset);
  std::operator+(__return_storage_ptr__,&local_40,") }");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GenConstructor(const std::string &offset) {
    return "{{VALUETYPE}}({{ACCESS}}.bb, o: " + offset + ") }";
  }